

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsTessControl::Run(SeparateProgramsTessControl *this)

{
  GLenum *pGVar1;
  GLint *pGVar2;
  uint uVar3;
  long lVar4;
  uint program;
  mapped_type *pmVar5;
  long error;
  GLenum props3 [12];
  GLint expected3 [12];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  key_type local_d8;
  GLint expected2 [10];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  char *srcTCS;
  GLenum props2 [10];
  
  error = 0;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])(this,0x8e88,1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f6,0x10,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f5,5,&error);
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesI._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesO._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar1 = props3 + 4;
  props3._0_8_ = pGVar1;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_PerVertex.gl_Position","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"data","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.r","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.g","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.b","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.iLikePie","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_PerVertex.gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props3);
  uVar3 = *pmVar5;
  pGVar2 = expected3 + 4;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"gl_PerVertex.gl_Position","")
  ;
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"data","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"data","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.r","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"Color.r","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.g","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"Color.g","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.b","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"Color.b","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.iLikePie","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"Color.iLikePie","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props2[4] = 0x930a;
  props2[5] = 0x9309;
  props2[6] = 0x9307;
  props2[7] = 0x9308;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  props2[8] = 0x9306;
  props2[9] = 0x92e7;
  expected2[4] = 0;
  expected2[5] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[0] = 0xf;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[6] = 1;
  expected2[7] = 0;
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"Color.iLikePie","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar5,10,props2,10,expected2,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3[8] = 0x9306;
  props3[9] = 0x92e7;
  props3[10] = 0x930e;
  props3[0xb] = 0x930f;
  props3[4] = 0x930a;
  props3[5] = 0x9309;
  props3[6] = 0x9307;
  props3[7] = 0x9308;
  props3[0] = 0x92f9;
  props3[1] = 0x92fa;
  props3[2] = 0x92fb;
  props3[3] = 0x930b;
  expected3[4] = 0;
  expected3[5] = 0;
  expected3[0] = 5;
  expected3[1] = 0x8b52;
  expected3[2] = 1;
  expected3[3] = 0;
  expected3[6] = 1;
  expected3[7] = 0;
  expected3[8] = 0;
  expected3[9] = 1;
  expected3[10] = 0;
  expected3[0xb] = -1;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"data","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,&local_d8);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar5,0xc,props3,0xc,expected3,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  lVar4 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesO._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesI._M_t);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                                  \n"
							 "layout(vertices = 3) out;                                     \n"
							 "layout(location = 0) patch out vec4 data;                     \n"
							 "out gl_PerVertex {                                            \n"
							 "   vec4 gl_Position;                                          \n"
							 "   float gl_PointSize;                                        \n"
							 "   float gl_ClipDistance[];                                   \n"
							 "} gl_out[];                                                   \n"
							 ""
							 "in Color {                                 \n"
							 "  float r, g, b;                           \n"
							 "  vec4 iLikePie;                           \n"
							 "} vs_color[];                              \n"
							 ""
							 "void main() {                                                                   \n"
							 "   data = vec4(1);                                                              \n"
							 "   gl_out[gl_InvocationID].gl_Position =                                        \n"
							 "           vec4(vs_color[0].r, vs_color[0].g, vs_color[0].b, vs_color[0].iLikePie.x + "
							 "float(gl_InvocationID));       \n"
							 "   gl_TessLevelInner[0] = 1.0;                                                  \n"
							 "   gl_TessLevelInner[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[0] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[1] = 1.0;                                                  \n"
							 "   gl_TessLevelOuter[2] = 1.0;                                                  \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_TESS_CONTROL_SHADER, 1, &srcTCS);

		// gl_InvocationID should be included
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 16, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 5, error);

		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "data", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.r", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.g", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.b", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "Color.iLikePie", error);

		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_PerVertex.gl_Position"],
									 "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], "data", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.r"], "Color.r", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.g"], "Color.g", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.b"], "Color.b", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], "Color.iLikePie", error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 15, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["Color.iLikePie"], 10, props2, 10, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 5, GL_FLOAT_VEC4, 1, 0, 0, 0, 1, 0, 0, 1, 0, -1 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["data"], 12, props3, 12, expected3, error);

		glDeleteProgram(tcs);
		return error;
	}